

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Settings::RealParam::RealParam(RealParam *this)

{
  long lVar1;
  
  lVar1 = 0x10;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x370);
  lVar1 = 0x370;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x6d0);
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)this->name[0]._M_string_length,0x611471);
  std::__cxx11::string::_M_replace
            ((ulong)this->description,0,(char *)this->description[0]._M_string_length,0x6112ed);
  this->lower[0] = 0.0;
  this->upper[0] = 1.0;
  this->defaultValue[0] = 1e-06;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 1),0,(char *)this->name[1]._M_string_length,0x6114d2);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 1),0,(char *)this->description[1]._M_string_length,0x61130a
            );
  this->lower[1] = 0.0;
  this->upper[1] = 1.0;
  this->defaultValue[1] = 1e-06;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 2),0,(char *)this->name[2]._M_string_length,0x611325);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 2),0,(char *)this->description[2]._M_string_length,0x611332
            );
  this->lower[2] = 0.0;
  this->upper[2] = 1.0;
  this->defaultValue[2] = 1e-16;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 3),0,(char *)this->name[3]._M_string_length,0x611349);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 3),0,(char *)this->description[3]._M_string_length,0x6113b5
            );
  this->lower[3] = 0.0;
  this->upper[3] = 1.0;
  this->defaultValue[3] = 1e-20;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 4),0,(char *)this->name[4]._M_string_length,0x61135f);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 4),0,(char *)this->description[4]._M_string_length,0x61136e
            );
  this->lower[4] = 0.0;
  this->upper[4] = 1.0;
  this->defaultValue[4] = 1e-16;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 5),0,(char *)this->name[5]._M_string_length,0x6113a1);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 5),0,(char *)this->description[5]._M_string_length,0x6113af
            );
  this->lower[5] = 0.0;
  this->upper[5] = 1.0;
  this->defaultValue[5] = 1e-10;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 6),0,(char *)this->name[6]._M_string_length,0x6113da);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 6),0,(char *)this->description[6]._M_string_length,0x6113e0
            );
  this->lower[6] = 10000000000.0;
  this->upper[6] = 1e+100;
  this->defaultValue[6] = 1e+100;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 7),0,(char *)this->name[7]._M_string_length,0x6113f3);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 7),0,(char *)this->description[7]._M_string_length,0x6113fd
            );
  this->lower[7] = 0.0;
  this->upper[7] = 1e+100;
  this->defaultValue[7] = 1e+100;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 8),0,(char *)this->name[8]._M_string_length,0x611413);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 8),0,(char *)this->description[8]._M_string_length,0x611422
            );
  this->lower[8] = -1e+100;
  this->upper[8] = 1e+100;
  this->defaultValue[8] = -1e+100;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 9),0,(char *)this->name[9]._M_string_length,0x611441);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 9),0,(char *)this->description[9]._M_string_length,0x611450
            );
  this->lower[9] = -1e+100;
  this->upper[9] = 1e+100;
  this->defaultValue[9] = 1e+100;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 10),0,(char *)this->name[10]._M_string_length,0x61146f);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 10),0,(char *)this->description[10]._M_string_length,
             0x611479);
  this->lower[10] = 0.0;
  this->upper[10] = 1.0;
  this->defaultValue[10] = 1e-09;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xb),0,(char *)this->name[0xb]._M_string_length,0x6114d0);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xb),0,(char *)this->description[0xb]._M_string_length,
             0x6114d9);
  this->lower[0xb] = 0.0;
  this->upper[0xb] = 1.0;
  this->defaultValue[0xb] = 1e-09;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xc),0,(char *)this->name[0xc]._M_string_length,0x61152f);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xc),0,(char *)this->description[0xc]._M_string_length,
             0x61153c);
  this->lower[0xc] = 1.0;
  this->upper[0xc] = 1e+100;
  this->defaultValue[0xc] = 1e+25;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xd),0,(char *)this->name[0xd]._M_string_length,0x611574);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xd),0,(char *)this->description[0xd]._M_string_length,
             0x61157f);
  this->lower[0xd] = 0.0;
  this->upper[0xd] = 0.1;
  this->defaultValue[0xd] = 0.000976562;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xe),0,(char *)this->name[0xe]._M_string_length,0x6115e9);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xe),0,(char *)this->description[0xe]._M_string_length,
             0x61157f);
  this->lower[0xe] = 10.0;
  this->upper[0xe] = 1e+100;
  this->defaultValue[0xe] = 1024.0;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0xf),0,(char *)this->name[0xf]._M_string_length,0x6115f4);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0xf),0,(char *)this->description[0xf]._M_string_length,
             0x611607);
  this->lower[0xf] = 0.0;
  this->upper[0xf] = 1.0;
  this->defaultValue[0xf] = 0.6;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x10),0,(char *)this->name[0x10]._M_string_length,0x611668);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x10),0,(char *)this->description[0x10]._M_string_length,
             0x61167e);
  this->lower[0x10] = 0.0;
  this->upper[0x10] = 1e+100;
  this->defaultValue[0x10] = 1.2;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x11),0,(char *)this->name[0x11]._M_string_length,0x6116ee);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x11),0,(char *)this->description[0x11]._M_string_length,
             0x6116fa);
  this->lower[0x11] = 1.0;
  this->upper[0x11] = 1e+100;
  this->defaultValue[0x11] = 1.2;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x12),0,(char *)this->name[0x12]._M_string_length,0x611738);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x12),0,(char *)this->description[0x12]._M_string_length,
             0x61173f);
  this->lower[0x12] = 0.0;
  this->upper[0x12] = 1.0;
  this->defaultValue[0x12] = 0.0001;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x13),0,(char *)this->name[0x13]._M_string_length,0x611787);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x13),0,(char *)this->description[0x13]._M_string_length,
             0x611797);
  this->lower[0x13] = 1.0;
  this->upper[0x13] = 100.0;
  this->defaultValue[0x13] = 10.0;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x14),0,(char *)this->name[0x14]._M_string_length,0x6117f8);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x14),0,(char *)this->description[0x14]._M_string_length,
             0x61180a);
  this->lower[0x14] = 1.0;
  this->upper[0x14] = 100.0;
  this->defaultValue[0x14] = 5.0;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x15),0,(char *)this->name[0x15]._M_string_length,0x61186c);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x15),0,(char *)this->description[0x15]._M_string_length,
             0x61187d);
  this->lower[0x15] = 1.0;
  this->upper[0x15] = 10.0;
  this->defaultValue[0x15] = 1.5;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x16),0,(char *)this->name[0x16]._M_string_length,0x6118ce);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x16),0,(char *)this->description[0x16]._M_string_length,
             0x6118dc);
  this->lower[0x16] = 1.0;
  this->upper[0x16] = 1e+100;
  this->defaultValue[0x16] = 1000.0;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x17),0,(char *)this->name[0x17]._M_string_length,0x611943);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x17),0,(char *)this->description[0x17]._M_string_length,
             0x61194e);
  this->lower[0x17] = -1e+100;
  this->upper[0x17] = 1e+100;
  this->defaultValue[0x17] = 0.0;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x18),0,(char *)this->name[0x18]._M_string_length,0x61196a);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x18),0,(char *)this->description[0x18]._M_string_length,
             0x611978);
  this->lower[0x18] = 0.0001;
  this->upper[0x18] = 0.9999;
  this->defaultValue[0x18] = 0.01;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x19),0,(char *)this->name[0x19]._M_string_length,0x6119a8);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x19),0,(char *)this->description[0x19]._M_string_length,
             0x6119c0);
  this->lower[0x19] = 0.0;
  this->upper[0x19] = 1.0;
  this->defaultValue[0x19] = 1.0;
  std::__cxx11::string::_M_replace
            ((ulong)(this->name + 0x1a),0,(char *)this->name[0x1a]._M_string_length,0x611a45);
  std::__cxx11::string::_M_replace
            ((ulong)(this->description + 0x1a),0,(char *)this->description[0x1a]._M_string_length,
             0x611a5f);
  this->lower[0x1a] = 1.0;
  this->upper[0x1a] = 10.0;
  this->defaultValue[0x1a] = 1.5;
  return;
}

Assistant:

SoPlexBase<R>::Settings::RealParam::RealParam()
{
   // primal feasibility tolerance
   name[SoPlexBase<R>::FEASTOL] = "feastol";
   description[SoPlexBase<R>::FEASTOL] = "primal feasibility tolerance";
   lower[SoPlexBase<R>::FEASTOL] = 0.0;
   upper[SoPlexBase<R>::FEASTOL] = 1.0;
   defaultValue[SoPlexBase<R>::FEASTOL] = 1e-6;

   // dual feasibility tolerance
   name[SoPlexBase<R>::OPTTOL] = "opttol";
   description[SoPlexBase<R>::OPTTOL] = "dual feasibility tolerance";
   lower[SoPlexBase<R>::OPTTOL] = 0.0;
   upper[SoPlexBase<R>::OPTTOL] = 1.0;
   defaultValue[SoPlexBase<R>::OPTTOL] = 1e-6;

   ///@todo define suitable values depending on R type
   // general zero tolerance
   name[SoPlexBase<R>::EPSILON_ZERO] = "epsilon_zero";
   description[SoPlexBase<R>::EPSILON_ZERO] = "general zero tolerance";
   lower[SoPlexBase<R>::EPSILON_ZERO] = 0.0;
   upper[SoPlexBase<R>::EPSILON_ZERO] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_ZERO] = SOPLEX_DEFAULT_EPS_ZERO;

   ///@todo define suitable values depending on R type
   // zero tolerance used in factorization
   name[SoPlexBase<R>::EPSILON_FACTORIZATION] = "epsilon_factorization";
   description[SoPlexBase<R>::EPSILON_FACTORIZATION] = "zero tolerance used in factorization";
   lower[SoPlexBase<R>::EPSILON_FACTORIZATION] = 0.0;
   upper[SoPlexBase<R>::EPSILON_FACTORIZATION] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_FACTORIZATION] = SOPLEX_DEFAULT_EPS_FACTOR;

   ///@todo define suitable values depending on R type
   // zero tolerance used in update of the factorization
   name[SoPlexBase<R>::EPSILON_UPDATE] = "epsilon_update";
   description[SoPlexBase<R>::EPSILON_UPDATE] = "zero tolerance used in update of the factorization";
   lower[SoPlexBase<R>::EPSILON_UPDATE] = 0.0;
   upper[SoPlexBase<R>::EPSILON_UPDATE] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_UPDATE] = SOPLEX_DEFAULT_EPS_UPDATE;

   ///@todo define suitable values depending on R type
   // pivot zero tolerance used in factorization
   name[SoPlexBase<R>::EPSILON_PIVOT] = "epsilon_pivot";
   description[SoPlexBase<R>::EPSILON_PIVOT] = "pivot zero tolerance used in factorization";
   lower[SoPlexBase<R>::EPSILON_PIVOT] = 0.0;
   upper[SoPlexBase<R>::EPSILON_PIVOT] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_PIVOT] = SOPLEX_DEFAULT_EPS_PIVOR;

   ///@todo define suitable values depending on R type
   // infinity threshold
   name[SoPlexBase<R>::INFTY] = "infty";
   description[SoPlexBase<R>::INFTY] = "infinity threshold";
   lower[SoPlexBase<R>::INFTY] = 1e10;
   upper[SoPlexBase<R>::INFTY] = 1e100;
   defaultValue[SoPlexBase<R>::INFTY] = SOPLEX_DEFAULT_INFINITY;

   // time limit in seconds (INFTY if unlimited)
   name[SoPlexBase<R>::TIMELIMIT] = "timelimit";
   description[SoPlexBase<R>::TIMELIMIT] = "time limit in seconds";
   lower[SoPlexBase<R>::TIMELIMIT] = 0.0;
   upper[SoPlexBase<R>::TIMELIMIT] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::TIMELIMIT] = SOPLEX_DEFAULT_INFINITY;

   // lower limit on objective value
   name[SoPlexBase<R>::OBJLIMIT_LOWER] = "objlimit_lower";
   description[SoPlexBase<R>::OBJLIMIT_LOWER] = "lower limit on objective value";
   lower[SoPlexBase<R>::OBJLIMIT_LOWER] = -SOPLEX_DEFAULT_INFINITY;
   upper[SoPlexBase<R>::OBJLIMIT_LOWER] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::OBJLIMIT_LOWER] = -SOPLEX_DEFAULT_INFINITY;

   // upper limit on objective value
   name[SoPlexBase<R>::OBJLIMIT_UPPER] = "objlimit_upper";
   description[SoPlexBase<R>::OBJLIMIT_UPPER] = "upper limit on objective value";
   lower[SoPlexBase<R>::OBJLIMIT_UPPER] = -SOPLEX_DEFAULT_INFINITY;
   upper[SoPlexBase<R>::OBJLIMIT_UPPER] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::OBJLIMIT_UPPER] = SOPLEX_DEFAULT_INFINITY;

   // working tolerance for feasibility in floating-point solver during iterative refinement
   name[SoPlexBase<R>::FPFEASTOL] = "fpfeastol";
   description[SoPlexBase<R>::FPFEASTOL] =
      "working tolerance for feasibility in floating-point solver during iterative refinement";
   lower[SoPlexBase<R>::FPFEASTOL] = 0;
   upper[SoPlexBase<R>::FPFEASTOL] = 1.0;
   defaultValue[SoPlexBase<R>::FPFEASTOL] = 1e-9;

   // working tolerance for optimality in floating-point solver during iterative refinement
   name[SoPlexBase<R>::FPOPTTOL] = "fpopttol";
   description[SoPlexBase<R>::FPOPTTOL] =
      "working tolerance for optimality in floating-point solver during iterative refinement";
   lower[SoPlexBase<R>::FPOPTTOL] = 0;
   upper[SoPlexBase<R>::FPOPTTOL] = 1.0;
   defaultValue[SoPlexBase<R>::FPOPTTOL] = 1e-9;

   // maximum increase of scaling factors between refinements
   name[SoPlexBase<R>::MAXSCALEINCR] = "maxscaleincr";
   description[SoPlexBase<R>::MAXSCALEINCR] =
      "maximum increase of scaling factors between refinements";
   lower[SoPlexBase<R>::MAXSCALEINCR] = 1.0;
   upper[SoPlexBase<R>::MAXSCALEINCR] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::MAXSCALEINCR] = 1e25;

   // lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)
   name[SoPlexBase<R>::LIFTMINVAL] = "liftminval";
   description[SoPlexBase<R>::LIFTMINVAL] =
      "lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)";
   lower[SoPlexBase<R>::LIFTMINVAL] = 0.0;
   upper[SoPlexBase<R>::LIFTMINVAL] = 0.1;
   defaultValue[SoPlexBase<R>::LIFTMINVAL] = 0.000976562; // = 1/1024

   // upper threshold in lifting (nonzero matrix coefficients with larger absolute value will be reformulated)
   name[SoPlexBase<R>::LIFTMAXVAL] = "liftmaxval";
   description[SoPlexBase<R>::LIFTMAXVAL] =
      "lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)";
   lower[SoPlexBase<R>::LIFTMAXVAL] = 10.0;
   upper[SoPlexBase<R>::LIFTMAXVAL] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::LIFTMAXVAL] = 1024.0;

   // threshold for using sparse pricing (no. of violations need to be smaller than threshold * dimension of problem)
   name[SoPlexBase<R>::SPARSITY_THRESHOLD] = "sparsity_threshold";
   description[SoPlexBase<R>::SPARSITY_THRESHOLD] =
      "sparse pricing threshold (#violations < dimension * SPARSITY_THRESHOLD activates sparse pricing)";
   lower[SoPlexBase<R>::SPARSITY_THRESHOLD] = 0.0;
   upper[SoPlexBase<R>::SPARSITY_THRESHOLD] = 1.0;
   defaultValue[SoPlexBase<R>::SPARSITY_THRESHOLD] = 0.6;

   // threshold on number of rows vs. number of columns for switching from column to row representations in auto mode
   name[SoPlexBase<R>::REPRESENTATION_SWITCH] = "representation_switch";
   description[SoPlexBase<R>::REPRESENTATION_SWITCH] =
      "threshold on number of rows vs. number of columns for switching from column to row representations in auto mode";
   lower[SoPlexBase<R>::REPRESENTATION_SWITCH] = 0.0;
   upper[SoPlexBase<R>::REPRESENTATION_SWITCH] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::REPRESENTATION_SWITCH] = 1.2;

   // geometric frequency at which to apply rational reconstruction
   name[SoPlexBase<R>::RATREC_FREQ] = "ratrec_freq";
   description[SoPlexBase<R>::RATREC_FREQ] =
      "geometric frequency at which to apply rational reconstruction";
   lower[SoPlexBase<R>::RATREC_FREQ] = 1.0;
   upper[SoPlexBase<R>::RATREC_FREQ] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::RATREC_FREQ] = 1.2;

   // minimal reduction (sum of removed rows/cols) to continue simplification
   name[SoPlexBase<R>::MINRED] = "minred";
   description[SoPlexBase<R>::MINRED] =
      "minimal reduction (sum of removed rows/cols) to continue simplification";
   lower[SoPlexBase<R>::MINRED] = 0.0;
   upper[SoPlexBase<R>::MINRED] = 1.0;
   defaultValue[SoPlexBase<R>::MINRED] = 1e-4;

   // refactor threshold for nonzeros in last factorized basis matrix compared to updated basis matrix
   name[SoPlexBase<R>::REFAC_BASIS_NNZ] = "refac_basis_nnz";
   description[SoPlexBase<R>::REFAC_BASIS_NNZ] =
      "refactor threshold for nonzeros in last factorized basis matrix compared to updated basis matrix";
   lower[SoPlexBase<R>::REFAC_BASIS_NNZ] = 1.0;
   upper[SoPlexBase<R>::REFAC_BASIS_NNZ] = 100.0;
   defaultValue[SoPlexBase<R>::REFAC_BASIS_NNZ] = 10.0;

   // refactor threshold for fill-in in current factor update compared to fill-in in last factorization
   name[SoPlexBase<R>::REFAC_UPDATE_FILL] = "refac_update_fill";
   description[SoPlexBase<R>::REFAC_UPDATE_FILL] =
      "refactor threshold for fill-in in current factor update compared to fill-in in last factorization";
   lower[SoPlexBase<R>::REFAC_UPDATE_FILL] = 1.0;
   upper[SoPlexBase<R>::REFAC_UPDATE_FILL] = 100.0;
   defaultValue[SoPlexBase<R>::REFAC_UPDATE_FILL] = 5.0;

   // refactor threshold for memory growth in factorization since last refactorization
   name[SoPlexBase<R>::REFAC_MEM_FACTOR] = "refac_mem_factor";
   description[SoPlexBase<R>::REFAC_MEM_FACTOR] =
      "refactor threshold for memory growth in factorization since last refactorization";
   lower[SoPlexBase<R>::REFAC_MEM_FACTOR] = 1.0;
   upper[SoPlexBase<R>::REFAC_MEM_FACTOR] = 10.0;
   defaultValue[SoPlexBase<R>::REFAC_MEM_FACTOR] = 1.5;

   // accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)
   name[SoPlexBase<R>::LEASTSQ_ACRCY] = "leastsq_acrcy";
   description[SoPlexBase<R>::LEASTSQ_ACRCY] =
      "accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)";
   lower[SoPlexBase<R>::LEASTSQ_ACRCY] = 1.0;
   upper[SoPlexBase<R>::LEASTSQ_ACRCY] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::LEASTSQ_ACRCY] = 1000.0;

   // objective offset
   name[SoPlexBase<R>::OBJ_OFFSET] = "obj_offset";
   description[SoPlexBase<R>::OBJ_OFFSET] = "objective offset to be used";
   lower[SoPlexBase<R>::OBJ_OFFSET] = -SOPLEX_DEFAULT_INFINITY;
   upper[SoPlexBase<R>::OBJ_OFFSET] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::OBJ_OFFSET] = 0.0;

   // minimal Markowitz threshold to control sparsity/stability in LU factorization
   name[SoPlexBase<R>::MIN_MARKOWITZ] = "min_markowitz";
   description[SoPlexBase<R>::MIN_MARKOWITZ] = "minimal Markowitz threshold in LU factorization";
   lower[SoPlexBase<R>::MIN_MARKOWITZ] = 0.0001;
   upper[SoPlexBase<R>::MIN_MARKOWITZ] = 0.9999;
   defaultValue[SoPlexBase<R>::MIN_MARKOWITZ] = 0.01;

   // modification
   name[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = "simplifier_modifyrowfac";
   description[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] =
      "modify constraints when the number of nonzeros or rows is at most this factor times the number of nonzeros or rows before presolving";
   lower[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = 0;
   upper[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = 1;
   defaultValue[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = 1.0;

   // factor by which the precision of the floating-point solver is multiplied
   name[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = "precision_boosting_factor";
   description[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] =
      "factor by which the precision of the floating-point solver is multiplied";
   lower[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = 1.0;
   upper[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = 10.0;
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = 1.5;
}